

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_utility.h
# Opt level: O0

tuple<int,_float> __thiscall
testinator::Arbitrary<std::tuple<int,_float>_>::generate
          (Arbitrary<std::tuple<int,_float>_> *this,size_t n,unsigned_long randomSeed)

{
  Arbitrary<std::tuple<float>_> local_38 [4];
  _Head_base<0UL,_float,_false> local_34;
  unsigned_long local_30;
  result_type r2;
  unsigned_long r1;
  unsigned_long randomSeed_local;
  size_t n_local;
  
  r2 = randomSeed;
  r1 = randomSeed;
  randomSeed_local = n;
  n_local = (size_t)this;
  local_30 = anon_unknown_6::nextRandom(randomSeed);
  local_34._M_head_impl = (float)detail::Arbitrary_Arithmetic<int>::generate(randomSeed_local,r2);
  Arbitrary<std::tuple<float>_>::generate(local_38,randomSeed_local,local_30);
  tuple_cons<int,std::tuple<float>>((int *)this,(tuple<float> *)&local_34,local_38);
  return (tuple<int,_float>)(_Tuple_impl<0UL,_int,_float>)this;
}

Assistant:

static std::tuple<Ts...> generate(std::size_t n, unsigned long int randomSeed)
    {
      auto r1 = randomSeed;
      auto r2 = nextRandom(r1);

      using H = std::tuple_element_t<0, std::tuple<Ts...>>;
      using T = decltype(tuple_tail(std::declval<std::tuple<Ts...>>()));
      return tuple_cons(Arbitrary<H>::generate(n, r1),
                        Arbitrary<T>::generate(n, r2));
    }